

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateIsInitialized
          (MessageBuilderGenerator *this,Printer *printer)

{
  long lVar1;
  ClassNameResolver *pCVar2;
  Printer *this_00;
  bool bVar3;
  JavaType JVar4;
  Type TVar5;
  FieldGeneratorInfo *pFVar6;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  LogMessage *pLVar9;
  ulong uVar10;
  long lVar11;
  int i;
  long lVar12;
  allocator local_a1;
  Printer *local_a0;
  FieldGeneratorInfo *local_98;
  ClassNameResolver *local_90;
  LogMessage local_88;
  
  io::Printer::Print<>(printer,"@java.lang.Override\npublic final boolean isInitialized() {\n");
  local_a0 = printer;
  io::Printer::Indent(printer);
  lVar11 = 0;
  lVar12 = 0;
  while( true ) {
    pDVar7 = this->descriptor_;
    uVar10 = (ulong)*(int *)(pDVar7 + 4);
    if ((long)uVar10 <= lVar12) break;
    lVar1 = *(long *)(pDVar7 + 0x28);
    pFVar6 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar11 + lVar1));
    if ((*(byte *)(lVar1 + 1 + lVar11) & 0x60) == 0x40) {
      io::Printer::Print<char[5],std::__cxx11::string>
                (local_a0,"if (!has$name$()) {\n  return false;\n}\n",(char (*) [5])0x3de831,
                 &pFVar6->capitalized_name);
    }
    lVar12 = lVar12 + 1;
    lVar11 = lVar11 + 0x48;
  }
  lVar12 = 0;
  lVar11 = 0;
  do {
    this_00 = local_a0;
    if ((int)uVar10 <= lVar11) {
      if (0 < *(int *)(pDVar7 + 0x78)) {
        io::Printer::Print<>(local_a0,"if (!extensionsAreInitialized()) {\n  return false;\n}\n");
      }
      io::Printer::Outdent(this_00);
      io::Printer::Print<>(this_00,"  return true;\n}\n\n");
      return;
    }
    lVar1 = *(long *)(pDVar7 + 0x28);
    pFVar8 = (FieldDescriptor *)(lVar1 + lVar12);
    local_98 = Context::GetFieldGeneratorInfo(this->context_,pFVar8);
    JVar4 = GetJavaType(pFVar8);
    if (JVar4 != JAVATYPE_MESSAGE) goto switchD_002f9d15_caseD_0;
    pDVar7 = FieldDescriptor::message_type(pFVar8);
    bVar3 = HasRequiredFields(pDVar7);
    if (!bVar3) goto switchD_002f9d15_caseD_0;
    pLVar9 = &local_88;
    switch(*(byte *)(lVar1 + 1 + lVar12) >> 5 & 3) {
    case 1:
      io::Printer::Print<char[5],std::__cxx11::string>
                (local_a0,
                 "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    return false;\n  }\n}\n"
                 ,(char (*) [5])0x3de831,&local_98->capitalized_name);
      break;
    case 2:
      pCVar2 = this->name_resolver_;
      pDVar7 = FieldDescriptor::message_type(pFVar8);
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                ((string *)&local_88,pCVar2,pDVar7);
      io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                (local_a0,"if (!get$name$().isInitialized()) {\n  return false;\n}\n",
                 (char (*) [5])0x42d84f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                 (char (*) [5])0x3de831,&local_98->capitalized_name);
      goto LAB_002f9eb9;
    case 3:
      pDVar7 = FieldDescriptor::message_type(pFVar8);
      if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x4b) == '\x01') {
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        local_90 = this->name_resolver_;
        std::__cxx11::string::string((string *)&local_88,"value",&local_a1);
        pFVar8 = Descriptor::FindFieldByName(pDVar7,(ConstStringParam)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        TVar5 = FieldDescriptor::type(pFVar8);
        if (TVar5 != TYPE_MESSAGE) {
          internal::LogMessage::LogMessage
                    (&local_88,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
                     ,0x41);
          pLVar9 = internal::LogMessage::operator<<
                             (&local_88,
                              "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (value_field->type()): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&local_a1,pLVar9);
          internal::LogMessage::~LogMessage(&local_88);
        }
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  ((string *)&stack0xffffffffffffffb0,local_90,pDVar7);
        io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                  (local_a0,
                   "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    return false;\n  }\n}\n"
                   ,(char (*) [5])0x42d84f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb0,(char (*) [5])0x3de831,&local_98->capitalized_name);
        pLVar9 = (LogMessage *)&stack0xffffffffffffffb0;
      }
      else {
        pCVar2 = this->name_resolver_;
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  ((string *)&local_88,pCVar2,pDVar7);
        io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                  (local_a0,
                   "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    return false;\n  }\n}\n"
                   ,(char (*) [5])0x42d84f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   (char (*) [5])0x3de831,&local_98->capitalized_name);
      }
LAB_002f9eb9:
      std::__cxx11::string::~string((string *)pLVar9);
    }
switchD_002f9d15_caseD_0:
    lVar11 = lVar11 + 1;
    pDVar7 = this->descriptor_;
    uVar10 = (ulong)*(uint *)(pDVar7 + 4);
    lVar12 = lVar12 + 0x48;
  } while( true );
}

Assistant:

void MessageBuilderGenerator::GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
              "if (!get$name$().isInitialized()) {\n"
              "  return false;\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
              "if (has$name$()) {\n"
              "  if (!get$name$().isInitialized()) {\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
                "for ($type$ item : get$name$Map().values()) {\n"
                "  if (!item.isInitialized()) {\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                MapValueImmutableClassdName(field->message_type(),
                                            name_resolver_),
                "name", info->capitalized_name);
          } else {
            printer->Print(
                "for (int i = 0; i < get$name$Count(); i++) {\n"
                "  if (!get$name$(i).isInitialized()) {\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                name_resolver_->GetImmutableClassName(field->message_type()),
                "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}